

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void __thiscall
ImGui::ClosePopupToLevel(ImGui *this,int remaining,bool restore_focus_to_window_under_popup)

{
  ImGuiNavLayer IVar1;
  ImGuiPopupData *pIVar2;
  ImGuiWindow *under_this_window;
  ImGuiContext *pIVar3;
  ImGuiPopupData *__dest;
  undefined7 in_register_00000011;
  ImGuiViewport *filter_viewport;
  ImGuiViewport *extraout_RDX;
  ImGuiViewport *extraout_RDX_00;
  ImGuiViewport *extraout_RDX_01;
  int iVar4;
  ImGuiWindow *window;
  int iVar5;
  
  pIVar3 = GImGui;
  filter_viewport =
       (ImGuiViewport *)CONCAT71(in_register_00000011,restore_focus_to_window_under_popup);
  iVar5 = (int)this;
  if ((GImGui->DebugLogFlags & 4) != 0) {
    DebugLog("[popup] ClosePopupToLevel(%d), restore_under=%d\n",(ulong)this & 0xffffffff,
             (ulong)(uint)remaining & 0xff);
    filter_viewport = extraout_RDX;
  }
  pIVar2 = (pIVar3->OpenPopupStack).Data;
  under_this_window = pIVar2[iVar5].Window;
  window = pIVar2[iVar5].RestoreNavWindow;
  iVar4 = (pIVar3->OpenPopupStack).Capacity;
  if (iVar4 < iVar5) {
    if (iVar4 == 0) {
      iVar4 = 8;
    }
    else {
      iVar4 = iVar4 / 2 + iVar4;
    }
    if (iVar4 <= iVar5) {
      iVar4 = iVar5;
    }
    __dest = (ImGuiPopupData *)MemAlloc((long)iVar4 * 0x38);
    pIVar2 = (pIVar3->OpenPopupStack).Data;
    filter_viewport = extraout_RDX_00;
    if (pIVar2 != (ImGuiPopupData *)0x0) {
      memcpy(__dest,pIVar2,(long)(pIVar3->OpenPopupStack).Size * 0x38);
      MemFree((pIVar3->OpenPopupStack).Data);
      filter_viewport = extraout_RDX_01;
    }
    (pIVar3->OpenPopupStack).Data = __dest;
    (pIVar3->OpenPopupStack).Capacity = iVar4;
  }
  (pIVar3->OpenPopupStack).Size = iVar5;
  if (((char)remaining != '\0') && (under_this_window != (ImGuiWindow *)0x0)) {
    if ((under_this_window->Flags & 0x10000000) != 0) {
      window = under_this_window->ParentWindow;
    }
    if (window == (ImGuiWindow *)0x0) {
      IVar1 = pIVar3->NavLayer;
      window = (ImGuiWindow *)0x0;
    }
    else {
      if (window->WasActive != true) {
        FocusTopMostWindowUnderOne(under_this_window,(ImGuiWindow *)0x0,filter_viewport,1);
        return;
      }
      IVar1 = pIVar3->NavLayer;
    }
    FocusWindow(window,(uint)(IVar1 == ImGuiNavLayer_Main));
    return;
  }
  return;
}

Assistant:

void ImGui::ClosePopupToLevel(int remaining, bool restore_focus_to_window_under_popup)
{
    ImGuiContext& g = *GImGui;
    IMGUI_DEBUG_LOG_POPUP("[popup] ClosePopupToLevel(%d), restore_under=%d\n", remaining, restore_focus_to_window_under_popup);
    IM_ASSERT(remaining >= 0 && remaining < g.OpenPopupStack.Size);

    // Trim open popup stack
    ImGuiPopupData prev_popup = g.OpenPopupStack[remaining];
    g.OpenPopupStack.resize(remaining);

    // Restore focus (unless popup window was not yet submitted, and didn't have a chance to take focus anyhow. See #7325 for an edge case)
    if (restore_focus_to_window_under_popup && prev_popup.Window)
    {
        ImGuiWindow* popup_window = prev_popup.Window;
        ImGuiWindow* focus_window = (popup_window->Flags & ImGuiWindowFlags_ChildMenu) ? popup_window->ParentWindow : prev_popup.RestoreNavWindow;
        if (focus_window && !focus_window->WasActive)
            FocusTopMostWindowUnderOne(popup_window, NULL, NULL, ImGuiFocusRequestFlags_RestoreFocusedChild); // Fallback
        else
            FocusWindow(focus_window, (g.NavLayer == ImGuiNavLayer_Main) ? ImGuiFocusRequestFlags_RestoreFocusedChild : ImGuiFocusRequestFlags_None);
    }
}